

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::ImageDescriptorCase::genFetchCoordStr_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int fetchPosNdx)

{
  int iVar1;
  ostream *poVar2;
  IVec3 fetchPos;
  ostringstream buf;
  undefined1 local_194 [12];
  VkImageViewType local_188 [94];
  
  BindingModel::anon_unknown_1::ImageFetchInstanceImages::getFetchPos
            ((ImageFetchInstanceImages *)local_194,*(VkImageViewType *)((long)this + 0x8c),
             *(deUint32 *)((long)this + 0x90),*(deUint32 *)((long)this + 0x94),fetchPosNdx);
  iVar1 = *(int *)((long)this + 0x8c);
  if ((iVar1 == 4) || (iVar1 == 1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    poVar2 = std::operator<<((ostream *)local_188,"ivec2(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_194._0_4_);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_194._4_4_);
    std::operator<<(poVar2,")");
    std::__cxx11::stringbuf::str();
  }
  else {
    if (iVar1 == 0) {
      local_188[0] = local_194._0_4_;
      de::toString<int>(__return_storage_ptr__,(int *)local_188);
      return __return_storage_ptr__;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    poVar2 = std::operator<<((ostream *)local_188,"ivec3(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_194._0_4_);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_194._4_4_);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_194._8_4_);
    std::operator<<(poVar2,")");
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageDescriptorCase::genFetchCoordStr (int fetchPosNdx) const
{
	DE_ASSERT(m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE || m_descriptorType == vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE);
	const tcu::IVec3 fetchPos = ImageFetchInstanceImages::getFetchPos(m_viewType, m_baseMipLevel, m_baseArraySlice, fetchPosNdx);

	if (m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D)
	{
		return de::toString(fetchPos.x());
	}
	else if (m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY || m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D)
	{
		std::ostringstream buf;
		buf << "ivec2(" << fetchPos.x() << ", " << fetchPos.y() << ")";
		return buf.str();
	}
	else
	{
		std::ostringstream buf;
		buf << "ivec3(" << fetchPos.x() << ", " << fetchPos.y() << ", " << fetchPos.z() << ")";
		return buf.str();
	}
}